

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> __thiscall
wabt::MakeUnique<wabt::TableImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  undefined8 *puVar1;
  string_view local_28;
  
  puVar1 = (undefined8 *)operator_new(0x90);
  local_28.data_ = (args->_M_dataplus)._M_p;
  local_28.size_ = args->_M_string_length;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  *(undefined4 *)(puVar1 + 9) = 1;
  *puVar1 = &PTR__TableImport_002cebd8;
  string_view::to_string_abi_cxx11_((string *)(puVar1 + 10),&local_28);
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  *(undefined4 *)((long)puVar1 + 0x7f) = 0;
  *(undefined4 *)(puVar1 + 0x11) = 0xfffffff0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}